

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_true>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  _func_int **pp_Var6;
  undefined4 uVar7;
  uint uVar8;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  NodeRef *pNVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar17;
  vfloat_impl<4> __tmp_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar23;
  undefined1 auVar24 [64];
  float fVar25;
  float fVar30;
  float fVar31;
  vfloat_impl<4> __tmp;
  undefined1 auVar26 [16];
  float fVar32;
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar29;
  vint4 ai_2;
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  undefined1 in_ZMM3 [64];
  vint4 ai_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_3;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_3;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_2;
  undefined1 auVar55 [64];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 local_17f8 [16];
  undefined1 local_17b8 [16];
  RTCIntersectFunctionNArguments local_17a0;
  Geometry *local_1770;
  undefined8 local_1768;
  RTCIntersectArguments *local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar27 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    auVar5 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar27);
    iVar10 = vmovmskps_avx(auVar5);
    uVar11 = CONCAT44((int)((ulong)This >> 0x20),iVar10);
    if (iVar10 != 0) {
      auVar18 = *(undefined1 (*) [16])(ray + 0x40);
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar18,auVar20);
      auVar35._8_4_ = 0x219392ef;
      auVar35._0_8_ = 0x219392ef219392ef;
      auVar35._12_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar33,auVar35,1);
      auVar36 = vblendvps_avx(auVar18,auVar35,auVar33);
      auVar33 = *(undefined1 (*) [16])(ray + 0x50);
      auVar53 = vandps_avx(auVar33,auVar20);
      auVar53 = vcmpps_avx(auVar53,auVar35,1);
      auVar26 = vblendvps_avx(auVar33,auVar35,auVar53);
      auVar53 = *(undefined1 (*) [16])(ray + 0x60);
      auVar20 = vandps_avx(auVar53,auVar20);
      auVar20 = vcmpps_avx(auVar20,auVar35,1);
      auVar20 = vblendvps_avx(auVar53,auVar35,auVar20);
      auVar35 = vrcpps_avx(auVar36);
      fVar56 = auVar35._0_4_;
      auVar21._0_4_ = auVar36._0_4_ * fVar56;
      fVar57 = auVar35._4_4_;
      auVar21._4_4_ = auVar36._4_4_ * fVar57;
      fVar58 = auVar35._8_4_;
      auVar21._8_4_ = auVar36._8_4_ * fVar58;
      fVar59 = auVar35._12_4_;
      auVar21._12_4_ = auVar36._12_4_ * fVar59;
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar45,auVar21);
      auVar36 = vrcpps_avx(auVar26);
      fVar60 = auVar36._0_4_;
      auVar22._0_4_ = auVar26._0_4_ * fVar60;
      fVar61 = auVar36._4_4_;
      auVar22._4_4_ = auVar26._4_4_ * fVar61;
      fVar62 = auVar36._8_4_;
      auVar22._8_4_ = auVar26._8_4_ * fVar62;
      fVar63 = auVar36._12_4_;
      auVar22._12_4_ = auVar26._12_4_ * fVar63;
      auVar26 = vsubps_avx(auVar45,auVar22);
      auVar36 = vrcpps_avx(auVar20);
      fVar3 = auVar36._0_4_;
      auVar50._0_4_ = auVar20._0_4_ * fVar3;
      fVar4 = auVar36._4_4_;
      auVar50._4_4_ = auVar20._4_4_ * fVar4;
      fVar25 = auVar36._8_4_;
      auVar50._8_4_ = auVar20._8_4_ * fVar25;
      fVar30 = auVar36._12_4_;
      auVar50._12_4_ = auVar20._12_4_ * fVar30;
      auVar36 = vsubps_avx(auVar45,auVar50);
      auVar21 = ZEXT816(0);
      auVar18 = vcmpps_avx(auVar18,auVar21,1);
      auVar51._8_4_ = 1;
      auVar51._0_8_ = 0x100000001;
      auVar51._12_4_ = 1;
      auVar18 = vandps_avx(auVar51,auVar18);
      auVar33 = vcmpps_avx(auVar33,auVar21,1);
      auVar52._8_4_ = 2;
      auVar52._0_8_ = 0x200000002;
      auVar52._12_4_ = 2;
      auVar33 = vandps_avx(auVar33,auVar52);
      auVar20 = vorps_avx(auVar33,auVar18);
      auVar33 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar21);
      auVar18 = vcmpps_avx(auVar53,auVar21,1);
      auVar53._8_4_ = 4;
      auVar53._0_8_ = 0x400000004;
      auVar53._12_4_ = 4;
      auVar18 = vandps_avx(auVar53,auVar18);
      auVar64 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar65 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar27 = vpor_avx(auVar5 ^ auVar27,auVar18);
      auVar5 = *(undefined1 (*) [16])(ray + 0x20);
      local_17b8 = vpor_avx(auVar20,auVar27);
      do {
        lVar12 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar7 = *(undefined4 *)(local_17b8 + lVar12 * 4);
        auVar27._4_4_ = uVar7;
        auVar27._0_4_ = uVar7;
        auVar27._8_4_ = uVar7;
        auVar27._12_4_ = uVar7;
        auVar27 = vpcmpeqd_avx(auVar27,local_17b8);
        uVar7 = vmovmskps_avx(auVar27);
        uVar11 = uVar11 & ~CONCAT44((int)((ulong)lVar12 >> 0x20),uVar7);
      } while (uVar11 != 0);
      local_17b8 = vpcmpeqd_avx(local_17b8,local_17b8);
      auVar18 = vpcmpeqd_avx(local_17b8,(undefined1  [16])valid_i->field_0);
      fVar56 = fVar56 + auVar35._0_4_ * fVar56;
      fVar57 = fVar57 + auVar35._4_4_ * fVar57;
      fVar58 = fVar58 + auVar35._8_4_ * fVar58;
      fVar59 = fVar59 + auVar35._12_4_ * fVar59;
      fVar60 = auVar26._0_4_ * fVar60 + fVar60;
      fVar61 = auVar26._4_4_ * fVar61 + fVar61;
      fVar62 = auVar26._8_4_ * fVar62 + fVar62;
      fVar63 = auVar26._12_4_ * fVar63 + fVar63;
      auVar26._8_4_ = 0xff800000;
      auVar26._0_8_ = 0xff800000ff800000;
      auVar26._12_4_ = 0xff800000;
      local_17f8 = vblendvps_avx(auVar26,auVar33,auVar18);
      auVar27 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar27,auVar18);
      local_1708 = fVar3 + auVar36._0_4_ * fVar3;
      fStack_1704 = fVar4 + auVar36._4_4_ * fVar4;
      fStack_1700 = fVar25 + auVar36._8_4_ * fVar25;
      fStack_16fc = fVar30 + auVar36._12_4_ * fVar30;
      pNVar16 = stack_node + 2;
      paVar17 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = local_16f8;
      auVar55 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      local_1728 = *(undefined1 (*) [16])ray;
      local_1738 = *(undefined1 (*) [16])(ray + 0x10);
      local_1748 = fVar56;
      fStack_1744 = fVar57;
      fStack_1740 = fVar58;
      fStack_173c = fVar59;
      local_1758 = fVar60;
      fStack_1754 = fVar61;
      fStack_1750 = fVar62;
      fStack_174c = fVar63;
LAB_00ecf3c0:
      sVar9 = pNVar16[-1].ptr;
      if (sVar9 != 0xfffffffffffffff8) {
        pNVar16 = pNVar16 + -1;
        paVar1 = paVar17 + -1;
        auVar19 = ZEXT1664((undefined1  [16])*paVar1);
        paVar17 = paVar17 + -1;
        auVar27 = vcmpps_avx((undefined1  [16])*paVar1,local_17f8,1);
        if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar27[0xf] < '\0') {
          while( true ) {
            uVar8 = (uint)sVar9;
            if ((sVar9 & 8) != 0) break;
            uVar15 = sVar9 & 0xfffffffffffffff0;
            auVar24 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar11 = 0;
            sVar9 = 8;
            for (lVar12 = -0x10;
                (aVar23 = auVar24._0_16_, lVar12 != 0 &&
                (sVar14 = *(size_t *)(uVar15 + 0x20 + lVar12 * 2), sVar14 != 8));
                lVar12 = lVar12 + 4) {
              fVar3 = *(float *)(uVar15 + 0x90 + lVar12);
              fVar4 = *(float *)(uVar15 + 0x30 + lVar12);
              auVar27 = *(undefined1 (*) [16])(ray + 0x70);
              fVar25 = auVar27._0_4_;
              fVar30 = auVar27._4_4_;
              fVar31 = auVar27._8_4_;
              fVar32 = auVar27._12_4_;
              auVar33._0_4_ = fVar25 * fVar3 + fVar4;
              auVar33._4_4_ = fVar30 * fVar3 + fVar4;
              auVar33._8_4_ = fVar31 * fVar3 + fVar4;
              auVar33._12_4_ = fVar32 * fVar3 + fVar4;
              fVar3 = *(float *)(uVar15 + 0xb0 + lVar12);
              fVar4 = *(float *)(uVar15 + 0x50 + lVar12);
              auVar36._0_4_ = fVar25 * fVar3 + fVar4;
              auVar36._4_4_ = fVar30 * fVar3 + fVar4;
              auVar36._8_4_ = fVar31 * fVar3 + fVar4;
              auVar36._12_4_ = fVar32 * fVar3 + fVar4;
              fVar3 = *(float *)(uVar15 + 0xd0 + lVar12);
              fVar4 = *(float *)(uVar15 + 0x70 + lVar12);
              auVar39._0_4_ = fVar25 * fVar3 + fVar4;
              auVar39._4_4_ = fVar30 * fVar3 + fVar4;
              auVar39._8_4_ = fVar31 * fVar3 + fVar4;
              auVar39._12_4_ = fVar32 * fVar3 + fVar4;
              fVar3 = *(float *)(uVar15 + 0xa0 + lVar12);
              fVar4 = *(float *)(uVar15 + 0x40 + lVar12);
              auVar42._0_4_ = fVar25 * fVar3 + fVar4;
              auVar42._4_4_ = fVar30 * fVar3 + fVar4;
              auVar42._8_4_ = fVar31 * fVar3 + fVar4;
              auVar42._12_4_ = fVar32 * fVar3 + fVar4;
              fVar3 = *(float *)(uVar15 + 0xc0 + lVar12);
              fVar4 = *(float *)(uVar15 + 0x60 + lVar12);
              auVar46._0_4_ = fVar4 + fVar25 * fVar3;
              auVar46._4_4_ = fVar4 + fVar30 * fVar3;
              auVar46._8_4_ = fVar4 + fVar31 * fVar3;
              auVar46._12_4_ = fVar4 + fVar32 * fVar3;
              fVar3 = *(float *)(uVar15 + 0xe0 + lVar12);
              fVar4 = *(float *)(uVar15 + 0x80 + lVar12);
              auVar48._0_4_ = fVar3 * fVar25 + fVar4;
              auVar48._4_4_ = fVar3 * fVar30 + fVar4;
              auVar48._8_4_ = fVar3 * fVar31 + fVar4;
              auVar48._12_4_ = fVar3 * fVar32 + fVar4;
              auVar18 = vsubps_avx(auVar33,auVar64._0_16_);
              auVar54._0_4_ = fVar56 * auVar18._0_4_;
              auVar54._4_4_ = fVar57 * auVar18._4_4_;
              auVar54._8_4_ = fVar58 * auVar18._8_4_;
              auVar54._12_4_ = fVar59 * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar36,auVar65._0_16_);
              auVar37._0_4_ = fVar60 * auVar18._0_4_;
              auVar37._4_4_ = fVar61 * auVar18._4_4_;
              auVar37._8_4_ = fVar62 * auVar18._8_4_;
              auVar37._12_4_ = fVar63 * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar39,auVar55._0_16_);
              auVar40._0_4_ = local_1708 * auVar18._0_4_;
              auVar40._4_4_ = fStack_1704 * auVar18._4_4_;
              auVar40._8_4_ = fStack_1700 * auVar18._8_4_;
              auVar40._12_4_ = fStack_16fc * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar42,auVar64._0_16_);
              auVar43._0_4_ = fVar56 * auVar18._0_4_;
              auVar43._4_4_ = fVar57 * auVar18._4_4_;
              auVar43._8_4_ = fVar58 * auVar18._8_4_;
              auVar43._12_4_ = fVar59 * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar46,auVar65._0_16_);
              auVar47._0_4_ = fVar60 * auVar18._0_4_;
              auVar47._4_4_ = fVar61 * auVar18._4_4_;
              auVar47._8_4_ = fVar62 * auVar18._8_4_;
              auVar47._12_4_ = fVar63 * auVar18._12_4_;
              auVar18 = vsubps_avx(auVar48,auVar55._0_16_);
              auVar49._0_4_ = local_1708 * auVar18._0_4_;
              auVar49._4_4_ = fStack_1704 * auVar18._4_4_;
              auVar49._8_4_ = fStack_1700 * auVar18._8_4_;
              auVar49._12_4_ = fStack_16fc * auVar18._12_4_;
              auVar18 = vpminsd_avx(auVar54,auVar43);
              auVar33 = vpminsd_avx(auVar37,auVar47);
              auVar18 = vpmaxsd_avx(auVar18,auVar33);
              auVar33 = vpminsd_avx(auVar40,auVar49);
              auVar18 = vpmaxsd_avx(auVar18,auVar33);
              auVar33 = vpmaxsd_avx(auVar54,auVar43);
              auVar53 = vpmaxsd_avx(auVar37,auVar47);
              auVar53 = vpminsd_avx(auVar33,auVar53);
              auVar33 = vpmaxsd_avx(auVar40,auVar49);
              auVar33 = vpminsd_avx(auVar33,local_17f8);
              auVar53 = vpminsd_avx(auVar53,auVar33);
              auVar33 = vpmaxsd_avx(auVar18,(undefined1  [16])local_16f8);
              if ((uVar8 & 7) == 6) {
                auVar33 = vcmpps_avx(auVar33,auVar53,2);
                uVar7 = *(undefined4 *)(uVar15 + 0xf0 + lVar12);
                auVar41._4_4_ = uVar7;
                auVar41._0_4_ = uVar7;
                auVar41._8_4_ = uVar7;
                auVar41._12_4_ = uVar7;
                auVar53 = vcmpps_avx(auVar41,auVar27,2);
                uVar7 = *(undefined4 *)(uVar15 + 0x100 + lVar12);
                auVar44._4_4_ = uVar7;
                auVar44._0_4_ = uVar7;
                auVar44._8_4_ = uVar7;
                auVar44._12_4_ = uVar7;
                auVar27 = vcmpps_avx(auVar27,auVar44,1);
                auVar27 = vandps_avx(auVar53,auVar27);
                auVar27 = vandps_avx(auVar27,auVar33);
              }
              else {
                auVar27 = vcmpps_avx(auVar33,auVar53,2);
              }
              auVar33 = vcmpps_avx(local_17f8,auVar19._0_16_,6);
              auVar27 = vandps_avx(auVar27,auVar33);
              auVar27 = vpslld_avx(auVar27,0x1f);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar27[0xf] < '\0') {
                auVar38._8_4_ = 0x7f800000;
                auVar38._0_8_ = 0x7f8000007f800000;
                auVar38._12_4_ = 0x7f800000;
                aVar34 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar38,auVar18,auVar27);
                auVar27 = vcmpps_avx((undefined1  [16])aVar34,(undefined1  [16])aVar23,1);
                sVar13 = sVar9;
                aVar29 = aVar34;
                if (((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar27[0xf]) ||
                   (sVar13 = sVar14, sVar14 = sVar9, aVar29 = aVar23, aVar23 = aVar34, sVar9 != 8))
                {
                  aVar34 = aVar23;
                  uVar11 = uVar11 + 1;
                  pNVar16->ptr = sVar14;
                  pNVar16 = pNVar16 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar17->v = aVar29;
                  paVar17 = paVar17 + 1;
                }
                sVar9 = sVar13;
                auVar24 = ZEXT1664((undefined1  [16])aVar34);
              }
            }
            if (sVar9 == 8) goto LAB_00ecf3c0;
            auVar19 = ZEXT1664((undefined1  [16])aVar23);
            if (1 < uVar11) {
              aVar34 = paVar17[-2];
              aVar29 = paVar17[-1];
              auVar27 = vcmpps_avx((undefined1  [16])aVar34,(undefined1  [16])aVar29,1);
              aVar28 = aVar29;
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar27[0xf] < '\0') {
                paVar17[-2] = aVar29;
                paVar17[-1] = aVar34;
                auVar27 = vpermilps_avx(*(undefined1 (*) [16])(pNVar16 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar16 + -2) = auVar27;
                aVar28 = aVar34;
                aVar34 = aVar29;
              }
              auVar19 = ZEXT1664((undefined1  [16])aVar23);
              if (uVar11 != 2) {
                aVar29 = paVar17[-3];
                auVar27 = vcmpps_avx((undefined1  [16])aVar29,(undefined1  [16])aVar28,1);
                if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar27[0xf] < '\0') {
                  paVar17[-3] = aVar28;
                  paVar17[-1] = aVar29;
                  sVar14 = pNVar16[-3].ptr;
                  pNVar16[-3].ptr = pNVar16[-1].ptr;
                  pNVar16[-1].ptr = sVar14;
                  aVar29 = aVar28;
                }
                auVar27 = vcmpps_avx((undefined1  [16])aVar29,(undefined1  [16])aVar34,1);
                auVar19 = ZEXT1664((undefined1  [16])aVar23);
                if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar27[0xf] < '\0') {
                  paVar17[-3] = aVar34;
                  paVar17[-2] = aVar29;
                  auVar27 = vpermilps_avx(*(undefined1 (*) [16])(pNVar16 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar16 + -3) = auVar27;
                  auVar19 = ZEXT1664((undefined1  [16])aVar23);
                }
              }
            }
          }
          if (sVar9 == 0xfffffffffffffff8) {
            return;
          }
          local_1718 = vcmpps_avx(local_17f8,auVar19._0_16_,6);
          auVar19 = ZEXT1664(local_1718);
          if ((((local_1718 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_1718 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_1718 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_1718[0xf] < '\0') {
            for (lVar12 = 0; auVar27 = auVar19._0_16_, (ulong)(uVar8 & 0xf) - 8 != lVar12;
                lVar12 = lVar12 + 1) {
              local_17a0.geomID = *(uint *)((sVar9 & 0xfffffffffffffff0) + lVar12 * 8);
              local_1770 = (context->scene->geometries).items[local_17a0.geomID].ptr;
              uVar2 = local_1770->mask;
              auVar18._4_4_ = uVar2;
              auVar18._0_4_ = uVar2;
              auVar18._8_4_ = uVar2;
              auVar18._12_4_ = uVar2;
              auVar18 = vandps_avx(auVar18,*(undefined1 (*) [16])(ray + 0x90));
              auVar18 = vpcmpeqd_avx(auVar18,_DAT_01f45a50);
              auVar33 = auVar27 & ~auVar18;
              if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar33[0xf] < '\0') {
                mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vandnps_avx(auVar18,auVar27);
                local_17a0.primID = *(uint *)((sVar9 & 0xfffffffffffffff0) + 4 + lVar12 * 8);
                local_17a0.valid = (int *)&mask;
                local_17a0.geometryUserPtr = local_1770->userPtr;
                local_17a0.context = context->user;
                local_17a0.N = 4;
                local_1768 = 0;
                local_1760 = context->args;
                pp_Var6 = (_func_int **)local_1760->intersect;
                if (pp_Var6 == (_func_int **)0x0) {
                  pp_Var6 = local_1770[1].super_RefCount._vptr_RefCount;
                }
                local_17a0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var6)(&local_17a0);
                auVar64 = ZEXT1664(local_1728);
                auVar65 = ZEXT1664(local_1738);
                auVar55 = ZEXT1664(auVar5);
                auVar19 = ZEXT1664(local_1718);
                fVar56 = local_1748;
                fVar57 = fStack_1744;
                fVar58 = fStack_1740;
                fVar59 = fStack_173c;
                fVar60 = local_1758;
                fVar61 = fStack_1754;
                fVar62 = fStack_1750;
                fVar63 = fStack_174c;
              }
            }
            local_17f8 = vblendvps_avx(local_17f8,*(undefined1 (*) [16])(ray + 0x80),auVar27);
          }
        }
        goto LAB_00ecf3c0;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }